

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglxnativeinterfacehandler.cpp
# Opt level: O3

NativeResourceForContextFunction __thiscall
QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext
          (QXcbGlxNativeInterfaceHandler *this,QByteArray *resource)

{
  bool bVar1;
  code *pcVar2;
  
  if (resourceType(QByteArray_const&)::names == '\0') {
    nativeResourceFunctionForContext();
  }
  bVar1 = operator==(resource,(QByteArray *)&resourceType(QByteArray_const&)::names);
  if (bVar1) {
    pcVar2 = glxConfigForContext;
  }
  else {
    bVar1 = operator==(resource,(QByteArray *)&DAT_00112118);
    pcVar2 = (NativeResourceForContextFunction)0x0;
    if (bVar1) {
      pcVar2 = glxContextForContext;
    }
  }
  return pcVar2;
}

Assistant:

QPlatformNativeInterface::NativeResourceForContextFunction QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext(const QByteArray &resource) const
{
    switch (resourceType(resource)) {
    case GLXConfig:
        return glxConfigForContext;
    case GLXContext:
        return glxContextForContext;
    default:
        break;
    }
    return nullptr;
}